

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O2

bool __thiscall cppnet::ConnectSocket::Bind(ConnectSocket *this,string *ip,uint16_t port)

{
  Address *this_00;
  bool bVar1;
  SysCallInt32Result SVar2;
  SingletonLogger *pSVar3;
  char *pcVar4;
  SysCallInt64Result SVar5;
  
  if ((this->super_Socket)._sock == 0) {
    bVar1 = Address::IsIpv4(ip);
    SVar5 = OsHandle::TcpSocket(bVar1);
    if (SVar5._return_value < 0) {
      pSVar3 = Singleton<cppnet::SingletonLogger>::Instance();
      pcVar4 = ErrnoInfo(SVar5._errno);
      SingletonLogger::Error
                (pSVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
                 ,0x28,"create socket failed. errno:%d, info:%s",(ulong)(uint)SVar5._errno,pcVar4);
      return false;
    }
    (this->super_Socket)._sock = SVar5._return_value;
  }
  this_00 = &(this->super_Socket)._addr;
  bVar1 = Address::IsIpv4(ip);
  (this->super_Socket)._addr._address_type = AT_IPV6 - bVar1;
  Address::SetIp(this_00,ip);
  (this->super_Socket)._addr._port = port;
  SVar2 = OsHandle::Bind((this->super_Socket)._sock,this_00);
  bVar1 = SVar2._return_value < 0;
  if (bVar1) {
    pSVar3 = Singleton<cppnet::SingletonLogger>::Instance();
    pcVar4 = ErrnoInfo(SVar2._errno);
    SingletonLogger::Fatal
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
               ,0x35,"bind socket filed! error:%d, info:%s",(ulong)SVar2 >> 0x20,pcVar4);
    OsHandle::Close((this->super_Socket)._sock);
  }
  return !bVar1;
}

Assistant:

bool ConnectSocket::Bind(const std::string& ip, uint16_t port) {
    if (_sock == 0) {
        auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. errno:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
            return false;
        }
        _sock = ret._return_value;
    }
    _addr.SetType(Address::IsIpv4(ip) ? AT_IPV4 : AT_IPV6);
    _addr.SetIp(ip);
    _addr.SetAddrPort(port);

    auto ret = OsHandle::Bind(_sock, _addr);

#ifndef __win__ // WEPOLL don't support reuse_port
    if (ret._return_value < 0 && __reuse_port) {
        LOG_FATAL("bind socket filed! error:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
        OsHandle::Close(_sock);
        return false;
    }
#endif

    return true;
}